

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::FuncType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
          *values,FuncType *out,char *desc)

{
  Result RVar1;
  char *pcVar2;
  int __c;
  Var *__s;
  FuncType local_b8;
  Var local_78;
  
  Var::Var(&local_78,var);
  __s = &local_78;
  RVar1 = CheckIndex(this,&local_78,
                     (Index)(((long)(values->
                                    super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(values->
                                   super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
                                   )._M_impl.super__Vector_impl_data._M_start) / 0x38),desc);
  Var::~Var(&local_78);
  if (out != (FuncType *)0x0) {
    if (RVar1.enum_ == Ok) {
      pcVar2 = Var::index(var,(char *)__s,__c);
      FuncType::FuncType(&local_b8,
                         (values->
                         super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
                         )._M_impl.super__Vector_impl_data._M_start + ((ulong)pcVar2 & 0xffffffff));
    }
    else {
      local_b8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.type_index = 0;
      local_b8._52_4_ = 0;
    }
    FuncType::operator=(out,&local_b8);
    FuncType::~FuncType(&local_b8);
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}